

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

int Rtm_ManMarkAutoFwd(Rtm_Man_t *pRtm)

{
  Rtm_Obj_t *pRVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  pRVar1 = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vObjs,0);
  Rtm_ObjMarkAutoFwd_rec(pRVar1);
  for (iVar4 = 0; iVar4 < pRtm->vPis->nSize; iVar4 = iVar4 + 1) {
    pRVar1 = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vPis,iVar4);
    Rtm_ObjMarkAutoFwd_rec(pRVar1);
  }
  iVar5 = 0;
  for (iVar4 = 0; iVar4 < pRtm->vObjs->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(pRtm->vObjs,iVar4);
    uVar3 = *(uint *)((long)pvVar2 + 8) ^ 0x10;
    *(uint *)((long)pvVar2 + 8) = uVar3;
    iVar5 = iVar5 + (uint)((uVar3 >> 4 & 1) != 0);
  }
  return iVar5;
}

Assistant:

int Rtm_ManMarkAutoFwd( Rtm_Man_t * pRtm )
{
    Rtm_Obj_t * pObjRtm;
    int i, Counter = 0;
    // mark nodes reachable from the PIs
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    Rtm_ObjMarkAutoFwd_rec( pObjRtm );
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        Rtm_ObjMarkAutoFwd_rec( pObjRtm );
    // count the number of autonomous nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    {
        pObjRtm->fAuto = !pObjRtm->fAuto;
        Counter += pObjRtm->fAuto;
    }
    // mark the fanins of the autonomous nodes
    return Counter;
}